

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O1

void __thiscall
SyncFixture_SyncToBadVersions_Test::TestBody(SyncFixture_SyncToBadVersions_Test *this)

{
  database *db;
  undefined1 *puVar1;
  uint64_t *puVar2;
  AssertHelperData *pAVar3;
  bool bVar4;
  AssertionResult gtest_ar;
  TrueWithString gtest_msg;
  undefined1 local_c0 [8];
  bool local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_98 [32];
  transaction<std::unique_lock<mock_mutex>_> local_78;
  undefined4 local_34;
  
  pstore::get_error_category();
  local_34 = 2;
  puVar2 = &local_78.super_transaction_base.size_;
  local_78.super_transaction_base.dbsize_ = 0;
  local_78.super_transaction_base.db_ = (database *)0x0;
  local_78.super_transaction_base.size_ = 0;
  local_78.super_transaction_base._vptr_transaction_base = (_func_int **)puVar2;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    pstore::database::sync(&(this->super_SyncFixture).db_);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_78,0,(char *)local_78.super_transaction_base.db_,0x20ade2);
  testing::Message::Message((Message *)local_c0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,(char *)local_78.super_transaction_base._vptr_transaction_base);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
  if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_c0 !=
      (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)local_c0 + 8))();
  }
  if (local_78.super_transaction_base._vptr_transaction_base != (_func_int **)puVar2) {
    operator_delete(local_78.super_transaction_base._vptr_transaction_base,
                    local_78.super_transaction_base.size_ + 1);
  }
  db = &(this->super_SyncFixture).db_;
  puVar1 = &(this->super_SyncFixture).field_0x10;
  local_b8 = false;
  local_c0 = (undefined1  [8])puVar1;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_c0);
  local_b8 = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_78,db,(unique_lock<mock_mutex> *)local_c0);
  if ((local_b8 == true) &&
     ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_c0 !=
      (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0)) {
    local_b8 = false;
  }
  local_c0 = (undefined1  [8])&local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"a","");
  pAVar3 = (AssertHelperData *)(local_98 + 0x10);
  local_98._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"first value","");
  anon_unknown.dwarf_3cee70::SyncFixture::add
            (&this->super_SyncFixture,&local_78,(string *)local_c0,(string *)local_98);
  if ((AssertHelperData *)local_98._0_8_ != pAVar3) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if (local_c0 != (undefined1  [8])&local_b0) {
    operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
  }
  pstore::transaction_base::commit(&local_78.super_transaction_base);
  local_78.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00271290;
  pstore::transaction_base::rollback(&local_78.super_transaction_base);
  if ((local_78.lock_._M_owns == true) && (local_78.lock_._M_device != (mutex_type *)0x0)) {
    local_78.lock_._M_owns = false;
  }
  pstore::database::sync(db);
  local_b8 = false;
  local_c0 = (undefined1  [8])puVar1;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_c0);
  local_b8 = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_78,db,(unique_lock<mock_mutex> *)local_c0);
  if ((local_b8 == true) &&
     ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_c0 !=
      (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0)) {
    local_b8 = false;
  }
  local_c0 = (undefined1  [8])&local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"b","");
  local_98._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"second value","");
  anon_unknown.dwarf_3cee70::SyncFixture::add
            (&this->super_SyncFixture,&local_78,(string *)local_c0,(string *)local_98);
  if ((AssertHelperData *)local_98._0_8_ != pAVar3) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if (local_c0 != (undefined1  [8])&local_b0) {
    operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
  }
  pstore::transaction_base::commit(&local_78.super_transaction_base);
  local_78.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00271290;
  pstore::transaction_base::rollback(&local_78.super_transaction_base);
  if ((local_78.lock_._M_owns == true) && (local_78.lock_._M_device != (mutex_type *)0x0)) {
    local_78.lock_._M_owns = false;
  }
  pstore::get_error_category();
  local_34 = 2;
  local_78.super_transaction_base.dbsize_ = 0;
  puVar2 = &local_78.super_transaction_base.size_;
  local_78.super_transaction_base.db_ = (database *)0x0;
  local_78.super_transaction_base.size_ = 0;
  local_78.super_transaction_base._vptr_transaction_base = (_func_int **)puVar2;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    pstore::database::sync(db);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_78,0,(char *)local_78.super_transaction_base.db_,0x20ade2);
  testing::Message::Message((Message *)local_c0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,(char *)local_78.super_transaction_base._vptr_transaction_base);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_c0 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(size_type *)local_c0 + 8))();
  }
  if (local_78.super_transaction_base._vptr_transaction_base != (_func_int **)puVar2) {
    operator_delete(local_78.super_transaction_base._vptr_transaction_base,
                    local_78.super_transaction_base.size_ + 1);
  }
  return;
}

Assistant:

TEST_F (SyncFixture, SyncToBadVersions) {
    check_for_error ([this] () { db_.sync (1); }, pstore::error_code::unknown_revision);

    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->add (t1, "a", "first value");
        t1.commit ();
    }
    db_.sync (1);
    {
        transaction_type t2 = begin (db_, lock_guard{mutex_});
        this->add (t2, "b", "second value");
        t2.commit ();
    }

    check_for_error ([this] () { db_.sync (3); }, pstore::error_code::unknown_revision);
}